

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parquet_crypto.cpp
# Opt level: O3

void __thiscall duckdb::DecryptionTransport::Initialize(DecryptionTransport *this,string *key)

{
  int iVar1;
  EncryptionState *pEVar2;
  data_t length_buf [4];
  uint32_t local_1c;
  
  (*this->trans->_vptr_TTransport[6])(this->trans,&local_1c,4);
  this->total_bytes = local_1c;
  this->transport_remaining = local_1c;
  iVar1 = (*this->trans->_vptr_TTransport[6])(this->trans,this->nonce,0xc);
  this->transport_remaining = this->transport_remaining - iVar1;
  pEVar2 = shared_ptr<duckdb::EncryptionState,_true>::operator->(&this->aes);
  (*pEVar2->_vptr_EncryptionState[3])(pEVar2,this->nonce,0xc,key);
  return;
}

Assistant:

void Initialize(const string &key) {
		// Read encoded length (don't add to read_bytes)
		data_t length_buf[ParquetCrypto::LENGTH_BYTES];
		trans.read(length_buf, ParquetCrypto::LENGTH_BYTES);
		total_bytes = Load<uint32_t>(length_buf);
		transport_remaining = total_bytes;
		// Read nonce and initialize AES
		transport_remaining -= trans.read(nonce, ParquetCrypto::NONCE_BYTES);
		// check whether context is initialized
		aes->InitializeDecryption(nonce, ParquetCrypto::NONCE_BYTES, &key);
	}